

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  ImU32 *pIVar1;
  ImU32 IVar2;
  ImGuiWindowSettings *pIVar3;
  ImU32 *pIVar4;
  ImU32 *pIVar5;
  
  IVar2 = ImHashStr(name,0,0);
  pIVar5 = (ImU32 *)(GImGui->SettingsWindows).Buf.Data;
  pIVar1 = pIVar5 + 1;
  if (pIVar5 != (ImU32 *)0x0) {
    pIVar4 = pIVar1;
    do {
      pIVar5 = pIVar4;
      if (*pIVar5 == IVar2) break;
      pIVar4 = (ImU32 *)((long)(int)pIVar5[-1] + (long)pIVar5);
      pIVar5 = (ImU32 *)0x0;
    } while (pIVar4 != (ImU32 *)((long)(GImGui->SettingsWindows).Buf.Size + (long)pIVar1));
  }
  if (pIVar5 != (ImU32 *)0x0) {
    return pIVar5;
  }
  pIVar3 = ImGui::CreateNewWindowSettings(name);
  return pIVar3;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindWindowSettings(ImHashStr(name));
    if (!settings)
        settings = ImGui::CreateNewWindowSettings(name);
    return (void*)settings;
}